

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O2

TPZAutoPointer<TPZMatrix<float>_> __thiscall
TPZSTShiftAndInvert<float>::CalcMatrix
          (TPZSTShiftAndInvert<float> *this,TPZAutoPointer<TPZMatrix<float>_> *A,
          TPZAutoPointer<TPZMatrix<float>_> *B)

{
  atomic_int *paVar1;
  float value;
  TPZSpectralTransform<float> TVar2;
  int iVar3;
  undefined8 *in_RCX;
  TPZFMatrixRef<float> local_1e8;
  TPZFMatrixRef<float> local_150;
  TPZFMatrix<float> local_b8;
  
  TVar2 = (TPZSpectralTransform<float>)B->fRef;
  (this->super_TPZSTShiftOrigin<float>).super_TPZSpectralTransform<float> = TVar2;
  LOCK();
  paVar1 = (atomic_int *)((long)TVar2 + 8);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  value = *(float *)&A[1].fRef;
  TVar2 = (this->super_TPZSTShiftOrigin<float>).super_TPZSpectralTransform<float>;
  TPZMatrix<float>::Storage(&local_1e8,*(TPZMatrix<float> **)TVar2);
  TPZMatrix<float>::Storage(&local_150,*(TPZMatrix<float> **)*in_RCX);
  TPZFMatrixRef<float>::~TPZFMatrixRef(&local_150);
  TPZFMatrixRef<float>::~TPZFMatrixRef(&local_1e8);
  if (local_1e8.super_TPZFMatrix<float>.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow !=
      local_150.super_TPZFMatrix<float>.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual TPZAutoPointer<TPZMatrix<TVar>> TPZSTShiftAndInvert<float>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>, TPZAutoPointer<TPZMatrix<TVar>>) const [TVar = float]"
                   );
    std::operator<<((ostream *)&std::cerr,
                    "\nERROR: Matrices have uncompatible storage formats.\nAborting...\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/EigenSolvers/TPZSpectralTransform.cpp"
               ,0x51);
  }
  TPZMatrix<float>::Storage(&local_1e8,*(TPZMatrix<float> **)*in_RCX);
  TPZFMatrix<float>::operator*(&local_b8,&local_1e8.super_TPZFMatrix<float>,value);
  TPZMatrix<float>::Storage(&local_150,*(TPZMatrix<float> **)TVar2);
  TPZFMatrix<float>::operator-=(&local_150.super_TPZFMatrix<float>,&local_b8.super_TPZMatrix<float>)
  ;
  TPZFMatrixRef<float>::~TPZFMatrixRef(&local_150);
  TPZFMatrix<float>::~TPZFMatrix(&local_b8);
  TPZFMatrixRef<float>::~TPZFMatrixRef(&local_1e8);
  iVar3 = (**(code **)(**(long **)TVar2 + 0x80))();
  (**(code **)((ulong)(iVar3 != 0) * 0x20 + 0xb8 + **(long **)TVar2))();
  return (TPZAutoPointer<TPZMatrix<float>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftAndInvert<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  const auto &shift = this->Shift();
  if(shiftedMat->Storage().Rows() != B->Storage().Rows()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Matrices have uncompatible storage formats.\nAborting...\n";
    DebugStop();
  }
  shiftedMat->Storage() -= B->Storage() * shift;

  if (shiftedMat->IsSymmetric()) shiftedMat->Decompose_LDLt();
  else shiftedMat->Decompose_LU();
  return shiftedMat;
}